

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthStencilClearTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::DepthStencilClearCase::iterate(DepthStencilClearCase *this)

{
  bool bVar1;
  int iVar2;
  int height_00;
  deUint32 dVar3;
  deUint32 dVar4;
  RenderTarget *this_00;
  PixelFormat *this_01;
  NotSupportedError *this_02;
  char *str;
  TestLog *log;
  bool bVar5;
  byte local_ca;
  undefined1 local_80 [6];
  bool isOk;
  bool isLastIter;
  vector<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
  clears;
  RGBA local_60 [2];
  RGBA threshold;
  undefined1 local_50 [8];
  Surface reference;
  Surface result;
  int height;
  int width;
  RenderTarget *renderTarget;
  DepthStencilClearCase *this_local;
  
  this_00 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getWidth(this_00);
  height_00 = tcu::RenderTarget::getHeight(this_00);
  tcu::Surface::Surface((Surface *)&reference.m_pixels.m_cap,iVar2,height_00);
  tcu::Surface::Surface((Surface *)local_50,iVar2,height_00);
  this_01 = tcu::RenderTarget::getPixelFormat(this_00);
  clears.
  super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       tcu::PixelFormat::getColorThreshold(this_01);
  tcu::RGBA::RGBA((RGBA *)&clears.
                           super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,1,1,1,1);
  local_60[0] = tcu::operator+((RGBA *)((long)&clears.
                                               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       4),
                               (RGBA *)&clears.
                                        super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
  ::vector((vector<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
            *)local_80);
  if ((((this->m_testDepth & 1U) == 0) ||
      (iVar2 = tcu::RenderTarget::getDepthBits(this_00), iVar2 != 0)) &&
     (((this->m_testStencil & 1U) == 0 ||
      (iVar2 = tcu::RenderTarget::getStencilBits(this_00), iVar2 != 0)))) {
    str = tcu::TestNode::getName((TestNode *)this);
    dVar3 = deStringHash(str);
    dVar4 = deInt32Hash(this->m_curIter);
    generateClears(this,(vector<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
                         *)local_80,dVar3 ^ dVar4);
    renderGL(this,(Surface *)&reference.m_pixels.m_cap,
             (vector<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
              *)local_80);
    renderReference(this,(Surface *)local_50,
                    (vector<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
                     *)local_80);
    bVar5 = this->m_curIter + 1 == this->m_numIters;
    log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    bVar1 = tcu::pixelThresholdCompare
                      (log,"Result","Image comparison result",(Surface *)local_50,
                       (Surface *)&reference.m_pixels.m_cap,local_60,COMPARE_LOG_ON_ERROR - bVar5);
    if (!bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image comparison failed");
    }
    this->m_curIter = this->m_curIter + 1;
    local_ca = 1;
    if (!bVar5) {
      local_ca = bVar1 ^ 0xff;
    }
    std::
    vector<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
    ::~vector((vector<deqp::gles2::Functional::(anonymous_namespace)::Clear,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Clear>_>
               *)local_80);
    tcu::Surface::~Surface((Surface *)local_50);
    tcu::Surface::~Surface((Surface *)&reference.m_pixels.m_cap);
    return (uint)((local_ca & 1) == 0);
  }
  this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_02,"No depth/stencil buffers","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthStencilClearTests.cpp"
             ,0xd3);
  __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

DepthStencilClearCase::IterateResult DepthStencilClearCase::iterate (void)
{
	const tcu::RenderTarget&	renderTarget	= m_context.getRenderTarget();
	int							width			= renderTarget.getWidth();
	int							height			= renderTarget.getHeight();
	tcu::Surface				result			(width, height);
	tcu::Surface				reference		(width, height);
	tcu::RGBA					threshold		= renderTarget.getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<Clear>				clears;

	if ((m_testDepth && renderTarget.getDepthBits() == 0) ||
		(m_testStencil && renderTarget.getStencilBits() == 0))
		throw tcu::NotSupportedError("No depth/stencil buffers", "", __FILE__, __LINE__);

	generateClears(clears, deStringHash(getName())^deInt32Hash(m_curIter));
	renderGL(result, clears);
	renderReference(reference, clears);

	bool	isLastIter		= m_curIter+1 == m_numIters;
	bool	isOk			= tcu::pixelThresholdCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference, result, threshold, isLastIter ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

	if (!isOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	m_curIter += 1;
	return isLastIter || !isOk ? STOP : CONTINUE;
}